

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O2

string * __thiscall
duckdb::FileSystem::JoinPath(string *__return_storage_ptr__,FileSystem *this,string *a,string *b)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (a->_M_string_length == 0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)b);
  }
  else {
    (*this->_vptr_FileSystem[0x18])(&local_40);
    ::std::operator+(&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)a,
                     &local_40);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,&local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)b);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string FileSystem::JoinPath(const string &a, const string &b) {
	// FIXME: sanitize paths
	return a.empty() ? b : a + PathSeparator(a) + b;
}